

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5DecodeLocaleValue
              (sqlite3_value *pVal,char **ppText,int *pnText,char **ppLoc,int *pnLoc)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  pvVar3 = sqlite3_value_blob(pVal);
  iVar2 = sqlite3ValueBytes(pVal,'\x01');
  if (*(char *)((long)pvVar3 + 0x10) == '\0') {
    uVar5 = 0x10;
    uVar4 = 0x10;
  }
  else {
    uVar6 = 0x10;
    do {
      if (iVar2 - 1 == uVar6) {
        return 0x14;
      }
      uVar4 = uVar6 + 1;
      lVar1 = uVar6 + 1;
      uVar6 = uVar4;
    } while (*(char *)((long)pvVar3 + lVar1) != '\0');
    uVar5 = (uint)uVar4;
  }
  *ppLoc = (char *)((long)pvVar3 + 0x10);
  *pnLoc = uVar5 - 0x10;
  *ppText = (char *)((long)pvVar3 + uVar4 + 1);
  *pnText = iVar2 + ~uVar5;
  return 0;
}

Assistant:

static int sqlite3Fts5DecodeLocaleValue(
  sqlite3_value *pVal,
  const char **ppText,
  int *pnText,
  const char **ppLoc,
  int *pnLoc
){
  const char *p = sqlite3_value_blob(pVal);
  int n = sqlite3_value_bytes(pVal);
  int nLoc = 0;

  assert( sqlite3_value_type(pVal)==SQLITE_BLOB );
  assert( n>FTS5_LOCALE_HDR_SIZE );

  for(nLoc=FTS5_LOCALE_HDR_SIZE; p[nLoc]; nLoc++){
    if( nLoc==(n-1) ){
      return SQLITE_MISMATCH;
    }
  }
  *ppLoc = &p[FTS5_LOCALE_HDR_SIZE];
  *pnLoc = nLoc - FTS5_LOCALE_HDR_SIZE;

  *ppText = &p[nLoc+1];
  *pnText = n - nLoc - 1;
  return SQLITE_OK;
}